

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O1

void __thiscall
HFactor::btranCall(HFactor *this,HVector *vector,double expected_density,
                  HighsTimerClock *factor_timer_clock_pointer)

{
  int iVar1;
  
  iVar1 = vector->count;
  if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
    HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                      (factor_timer_clock_pointer->clock_).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[0x19]);
  }
  btranU(this,vector,expected_density,factor_timer_clock_pointer);
  btranL(this,vector,expected_density,factor_timer_clock_pointer);
  if (-1 < iVar1) {
    HVectorBase<double>::reIndex(vector);
  }
  if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
    HighsTimer::stop(factor_timer_clock_pointer->timer_pointer_,
                     (factor_timer_clock_pointer->clock_).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[0x19]);
    return;
  }
  return;
}

Assistant:

void HFactor::btranCall(HVector& vector, const double expected_density,
                        HighsTimerClock* factor_timer_clock_pointer) const {
  const bool use_indices = vector.count >= 0;
  FactorTimer factor_timer;
  factor_timer.start(FactorBtran, factor_timer_clock_pointer);
  btranU(vector, expected_density, factor_timer_clock_pointer);
  btranL(vector, expected_density, factor_timer_clock_pointer);
  // Possibly find the indices in order
  if (use_indices) vector.reIndex();
  factor_timer.stop(FactorBtran, factor_timer_clock_pointer);
}